

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmarking.cpp
# Opt level: O1

void perf_compute_integral_img
               (_func_void_float_ptr_integral_image_ptr *function,float *gray_image,
               benchmark_data *data,bool is_padded)

{
  ulong uVar1;
  ulong uVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  double *pdVar5;
  double *pdVar6;
  benchmark_data *pbVar7;
  integral_image *__ptr;
  uint64_t uVar8;
  undefined7 in_register_00000009;
  long lVar9;
  size_t j;
  long lVar10;
  undefined1 auVar11 [16];
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 in_ZMM2 [64];
  double cycles;
  vector<double,_std::allocator<double>_> cycleslist;
  long local_80;
  double local_78;
  double local_70;
  double *local_68;
  double *pdStack_60;
  double *local_58;
  double local_48;
  benchmark_data *local_40;
  double local_38;
  
  local_78 = 0.0;
  local_40 = data;
  if ((int)CONCAT71(in_register_00000009,is_padded) == 0) {
    __ptr = create_integral_img(data->width,data->height);
  }
  else {
    __ptr = create_padded_integral_img(data->width,data->height);
  }
  local_80 = 100;
  dVar12 = 1.0;
  do {
    local_80 = (long)(dVar12 * (double)local_80);
    cpuid_basic_info(0);
    uVar1 = rdtsc();
    for (lVar10 = local_80; lVar10 != 0; lVar10 = lVar10 + -1) {
      (*function)(gray_image,__ptr);
    }
    uVar2 = rdtsc();
    cpuid_basic_info(0);
    auVar11 = vcvtusi2sd_avx512f(in_ZMM2._0_16_,
                                 (((ulong)(uint)-(int)(uVar1 >> 0x20) << 0x20) -
                                 (uVar1 & 0xffffffff)) +
                                 (uVar2 & 0xffffffff) + (uVar2 & 0xffffffff00000000));
    local_78 = auVar11._0_8_;
    dVar12 = 100000000.0 / local_78;
  } while (2.0 < dVar12);
  local_68 = (double *)0x0;
  pdStack_60 = (double *)0x0;
  local_58 = (double *)0x0;
  local_38 = (double)local_80;
  local_48 = 0.0;
  lVar10 = 0;
  do {
    cpuid_basic_info(0);
    uVar3 = rdtsc();
    local_70 = (double)CONCAT44(local_70._4_4_,(int)uVar3);
    for (lVar9 = local_80; lVar9 != 0; lVar9 = lVar9 + -1) {
      (*function)(gray_image,__ptr);
    }
    uVar1 = rdtsc();
    cpuid_basic_info(0);
    auVar11 = vcvtusi2sd_avx512f(in_ZMM2._0_16_,
                                 (((ulong)(uint)-(int)((ulong)uVar3 >> 0x20) << 0x20) -
                                 ((ulong)local_70 & 0xffffffff)) +
                                 (uVar1 & 0xffffffff) + (uVar1 & 0xffffffff00000000));
    local_78 = auVar11._0_8_ / local_38;
    local_70 = local_78;
    if (pdStack_60 == local_58) {
      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                ((vector<double,std::allocator<double>> *)&local_68,(iterator)pdStack_60,&local_78);
    }
    else {
      *pdStack_60 = local_78;
      pdStack_60 = pdStack_60 + 1;
    }
    local_48 = local_48 + local_70;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 10);
  dVar12 = local_48 / 10.0;
  free(__ptr->padded_data);
  free(__ptr);
  pbVar7 = local_40;
  pdVar6 = pdStack_60;
  pdVar5 = local_68;
  lVar10 = local_40->num_flops;
  local_78 = dVar12;
  if (local_68 != pdStack_60) {
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_68,pdStack_60,(int)LZCOUNT((long)pdStack_60 - (long)local_68 >> 3) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pdVar5,pdVar6);
  }
  auVar13._0_8_ = ((double)lVar10 * 100.0) / dVar12;
  auVar13._8_8_ = 0;
  auVar16._8_8_ = 0x3fdfffffffffffff;
  auVar16._0_8_ = 0x3fdfffffffffffff;
  auVar4._8_8_ = 0x8000000000000000;
  auVar4._0_8_ = 0x8000000000000000;
  auVar11 = vpternlogq_avx512vl(auVar16,auVar13,auVar4,0xf8);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = auVar13._0_8_ + auVar11._0_8_;
  auVar4 = vroundsd_avx(auVar14,auVar14,0xb);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = local_78;
  auVar11 = vmovhps_avx(auVar15,*local_68);
  auVar11 = vcvttpd2uqq_avx512vl(auVar11);
  pbVar7->avg_cycles = auVar11._0_8_;
  pbVar7->min_cycles = auVar11._8_8_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = pdStack_60[-1];
  uVar8 = vcvttsd2usi_avx512f(auVar11);
  pbVar7->max_cycles = uVar8;
  pbVar7->flops_per_cycle = auVar4._0_8_ / 100.0;
  operator_delete(local_68,(long)local_58 - (long)local_68);
  return;
}

Assistant:

void perf_compute_integral_img(void (*function)(float *, struct integral_image *), float *gray_image,
                               struct benchmark_data &data, bool is_padded) {
    double cycles = 0.;
    long num_runs = 100;
    double multiplier = 1;
    uint64_t start, end;

    // Checking if integral image should be padded and initializing it
    struct integral_image *iimage;
    if (!is_padded) {
        iimage = create_integral_img(data.width, data.height);
    } else {
        iimage = create_padded_integral_img(data.width, data.height);
    }

#ifdef WARM_UP
    // Warm-up phase: we determine a number of executions that allows
    // the code to be executed for at least CYCLES_REQUIRED cycles.
    // This helps excluding timing overhead when measuring small runtimes.
    do {
        num_runs = num_runs * multiplier;
        start = start_tsc();
        for (size_t i = 0; i < num_runs; i++) {
            (*function)(gray_image, iimage);
        }
        end = stop_tsc(start);

        cycles = (double)end;
        multiplier = (CYCLES_REQUIRED) / (cycles);

    } while (multiplier > 2);
#endif

    std::vector<double> cycleslist;

    // Actual performance measurements repeated REP times.
    // We simply store all results and compute medians during post-processing.
    double total_cycles = 0;
    for (size_t j = 0; j < REP; j++) {
        start = start_tsc();
        for (size_t i = 0; i < num_runs; ++i) {
            (*function)(gray_image, iimage);
        }
        end = stop_tsc(start);

        cycles = ((double)end) / num_runs;
        total_cycles += cycles;

        cycleslist.push_back(cycles);
    }
    total_cycles /= REP;

    free(iimage->padded_data);
    free(iimage);

    cycles = total_cycles;  // cyclesList.front();
    double flops_per_cycle = round((100.0 * data.num_flops) / cycles) / 100.0;
    std::sort(cycleslist.begin(), cycleslist.end());
    data.avg_cycles = (uint64_t)cycles;
    data.min_cycles = (uint64_t)cycleslist.front();
    data.max_cycles = (uint64_t)cycleslist.back();
    data.flops_per_cycle = flops_per_cycle;
}